

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

void __thiscall
ParseContext::ParseContext
          (ParseContext *this,Allocator *allocator,int optimizationLevel,
          ArrayView<InplaceStr> activeImports)

{
  uint uVar1;
  InplaceStr *val;
  uint local_40;
  uint i;
  int optimizationLevel_local;
  Allocator *allocator_local;
  ParseContext *this_local;
  ArrayView<InplaceStr> activeImports_local;
  
  this_local = (ParseContext *)activeImports.data;
  activeImports_local.data._0_4_ = activeImports.count;
  Lexer::Lexer(&this->lexer,allocator);
  SmallArray<SynBinaryOpElement,_32U>::SmallArray(&this->binaryOpStack,allocator);
  SmallArray<SynNamespaceElement_*,_32U>::SmallArray(&this->namespaceList,allocator);
  this->optimizationLevel = optimizationLevel;
  SmallArray<InplaceStr,_8U>::SmallArray(&this->activeImports,allocator);
  SmallArray<ErrorInfo_*,_4U>::SmallArray(&this->errorInfo,allocator);
  CompilerStatistics::CompilerStatistics(&this->statistics);
  SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U>::SmallDenseMap
            (&this->nonTypeLocations,allocator);
  SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U>::SmallDenseMap
            (&this->nonFunctionDefinitionLocations,allocator);
  this->allocator = allocator;
  this->code = (char *)0x0;
  this->moduleRoot = (char *)0x0;
  this->bytecodeBuilder =
       (_func_char_ptr_Allocator_ptr_InplaceStr_char_ptr_bool_char_ptr_ptr_char_ptr_uint_int_ArrayView<InplaceStr>_CompilerStatistics_ptr
        *)0x0;
  this->firstLexeme = (Lexeme *)0x0;
  this->currentLexeme = (Lexeme *)0x0;
  this->lastLexeme = (Lexeme *)0x0;
  this->expressionGroupDepth = 0;
  this->expressionBlockDepth = 0;
  this->statementBlockDepth = 0;
  this->errorHandlerActive = false;
  this->errorPos = (char *)0x0;
  this->errorCount = 0;
  this->errorBuf = (char *)0x0;
  this->errorBufSize = 0;
  this->errorBufLocation = (char *)0x0;
  this->currentNamespace = (SynNamespaceElement *)0x0;
  local_40 = 0;
  while( true ) {
    uVar1 = ArrayView<InplaceStr>::size((ArrayView<InplaceStr> *)&this_local);
    if (uVar1 <= local_40) break;
    val = ArrayView<InplaceStr>::operator[]((ArrayView<InplaceStr> *)&this_local,local_40);
    SmallArray<InplaceStr,_8U>::push_back(&this->activeImports,val);
    local_40 = local_40 + 1;
  }
  return;
}

Assistant:

ParseContext::ParseContext(Allocator *allocator, int optimizationLevel, ArrayView<InplaceStr> activeImports): lexer(allocator), binaryOpStack(allocator), namespaceList(allocator), optimizationLevel(optimizationLevel), activeImports(allocator), errorInfo(allocator), nonTypeLocations(allocator), nonFunctionDefinitionLocations(allocator), allocator(allocator)
{
	code = NULL;

	moduleRoot = NULL;

	bytecodeBuilder = NULL;

	firstLexeme = NULL;
	currentLexeme = NULL;
	lastLexeme = NULL;

	expressionGroupDepth = 0;
	expressionBlockDepth = 0;
	statementBlockDepth = 0;

	errorHandlerActive = false;
	errorPos = NULL;
	errorCount = 0;
	errorBuf = NULL;
	errorBufSize = 0;
	errorBufLocation = NULL;

	currentNamespace = NULL;

	for(unsigned i = 0; i < activeImports.size(); i++)
		this->activeImports.push_back(activeImports[i]);
}